

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_assert.cpp
# Opt level: O0

void test_framework(void)

{
  duk_context *ctx_00;
  ostream *this;
  duk_context *ctx;
  
  ctx_00 = duk_create_heap((duk_alloc_function)0x0,(duk_realloc_function)0x0,(duk_free_function)0x0,
                           (void *)0x0,(duk_fatal_function)0x0);
  test_eval(ctx_00,"var test = 2;");
  test_eval_expect(ctx_00,"test",2);
  test_eval(ctx_00,"var str = \'Butts\';");
  test_eval_expect(ctx_00,"str","Butts");
  test_eval_expect_error(ctx_00,"#($*)@*(");
  test_assert(true);
  duk_destroy_heap(ctx_00);
  this = std::operator<<((ostream *)&std::cout,"Framework OK");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void test_framework() {
	duk_context* ctx = duk_create_heap_default();

	test_eval(ctx, "var test = 2;");
	test_eval_expect(ctx, "test", 2);
	test_eval(ctx, "var str = 'Butts';");
	test_eval_expect(ctx, "str", "Butts");
	test_eval_expect_error(ctx, "#($*)@*(");
	test_assert(true);

	duk_destroy_heap(ctx);

	std::cout << "Framework OK" << std::endl;
}